

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Marshal.c
# Opt level: O0

UINT16 TPMT_PUBLIC_Marshal(TPMT_PUBLIC *source,BYTE **buffer,INT32 *size)

{
  UINT16 UVar1;
  UINT16 UVar2;
  UINT16 UVar3;
  UINT16 UVar4;
  UINT16 UVar5;
  UINT16 UVar6;
  UINT16 result;
  INT32 *size_local;
  BYTE **buffer_local;
  TPMT_PUBLIC *source_local;
  
  UVar1 = UINT16_Marshal(&source->type,buffer,size);
  UVar2 = UINT16_Marshal(&source->nameAlg,buffer,size);
  UVar3 = UINT32_Marshal((UINT32 *)&source->objectAttributes,buffer,size);
  UVar4 = TPM2B_DIGEST_Marshal(&source->authPolicy,buffer,size);
  UVar5 = TPMU_PUBLIC_PARMS_Marshal(&source->parameters,buffer,size,(uint)source->type);
  UVar6 = TPMU_PUBLIC_ID_Marshal(&source->unique,buffer,size,(uint)source->type);
  return UVar1 + UVar2 + UVar3 + UVar4 + UVar5 + UVar6;
}

Assistant:

UINT16
TPMT_PUBLIC_Marshal(TPMT_PUBLIC *source, BYTE **buffer, INT32 *size)
{
    UINT16    result = 0;
    result = (UINT16)(result + TPMI_ALG_PUBLIC_Marshal((TPMI_ALG_PUBLIC *)&(source->type), buffer, size));
    result = (UINT16)(result + TPMI_ALG_HASH_Marshal((TPMI_ALG_HASH *)&(source->nameAlg), buffer, size));
    result = (UINT16)(result + TPMA_OBJECT_Marshal((TPMA_OBJECT *)&(source->objectAttributes), buffer, size));
    result = (UINT16)(result + TPM2B_DIGEST_Marshal((TPM2B_DIGEST *)&(source->authPolicy), buffer, size));
    result = (UINT16)(result + TPMU_PUBLIC_PARMS_Marshal((TPMU_PUBLIC_PARMS *)&(source->parameters), buffer, size, (UINT32)source->type));
    result = (UINT16)(result + TPMU_PUBLIC_ID_Marshal((TPMU_PUBLIC_ID *)&(source->unique), buffer, size, (UINT32)source->type));
    return result;
}